

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void incomplete_block_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t metalen;
  void *pvVar3;
  fdb_kvs_handle *in_stack_fffffffffffffb18;
  fdb_file_handle *fhandle;
  fdb_doc **in_stack_fffffffffffffb28;
  char *in_stack_fffffffffffffb40;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  fhandle = (fdb_file_handle *)0x111c45;
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fdb_open((fdb_file_handle **)bodybuf._216_8_,(char *)bodybuf._208_8_,(fdb_config *)bodybuf._200_8_
          );
  fdb_kvs_open_default
            (fhandle,(fdb_kvs_handle **)in_stack_fffffffffffffb18,(fdb_kvs_config *)0x111cea);
  pvVar3 = (void *)0x111d01;
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"incomplete_block_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pvVar3 = (void *)0x111d34;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x904);
    incomplete_block_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x904,"void incomplete_block_test()");
    }
  }
  for (n = 0; n < 2; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    in_stack_fffffffffffffb28 = (fdb_doc **)(&stack0xfffffffffffffb18 + (long)n * 8);
    strlen(metabuf + 0xf8);
    in_stack_fffffffffffffb40 = bodybuf + 0xf8;
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x111e37;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create(in_stack_fffffffffffffb28,fhandle,(size_t)in_stack_fffffffffffffb18,pvVar3,
                   metalen,(void *)0x111e6e,(size_t)in_stack_fffffffffffffb40);
    pvVar3 = (void *)0x111e87;
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffb18 + (long)n * 8));
  }
  n = 0;
  while( true ) {
    if (1 < n) {
      fdb_kvs_close(in_stack_fffffffffffffb18);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffffb18);
      for (n = 0; n < 2; n = n + 1) {
        fdb_doc_free((fdb_doc *)0x1120d2);
      }
      fdb_shutdown();
      memleak_end();
      if (incomplete_block_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","incomplete block test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","incomplete block test");
      }
      return;
    }
    fdb_doc_create(in_stack_fffffffffffffb28,fhandle,(size_t)in_stack_fffffffffffffb18,pvVar3,0,
                   (void *)0x111ee7,(size_t)in_stack_fffffffffffffb40);
    fVar1 = fdb_get((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x917);
      incomplete_block_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x917,"void incomplete_block_test()");
      }
    }
    iVar2 = memcmp(pvRam0000000000000038,
                   *(void **)(*(long *)(&stack0xfffffffffffffb18 + (long)n * 8) + 0x38),
                   sRam0000000000000008);
    if (iVar2 != 0) break;
    iVar2 = memcmp(pvRam0000000000000040,
                   *(void **)(*(long *)(&stack0xfffffffffffffb18 + (long)n * 8) + 0x40),
                   sRam0000000000000010);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffffb18 + (long)n * 8) + 0x40),
              pvRam0000000000000040,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x919);
      incomplete_block_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x919,"void incomplete_block_test()");
    }
    pvVar3 = (void *)0x11208a;
    fdb_doc_free((fdb_doc *)0x11208a);
    n = n + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
          *(undefined8 *)(*(long *)(&stack0xfffffffffffffb18 + (long)n * 8) + 0x38),
          pvRam0000000000000038,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x918);
  incomplete_block_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x918,"void incomplete_block_test()");
}

Assistant:

void incomplete_block_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 2;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "incomplete_block_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        // updated documents
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("incomplete block test");
}